

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O0

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_>::
writeErrorBars(AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_> *this,
              ostream *stream,string *errorMessage,ErrorHandling errorHandling)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  double *pdVar4;
  undefined8 uVar5;
  int in_ECX;
  ostream *in_RSI;
  Vector3<double> *in_RDI;
  int i;
  size_t count;
  Vector3d err;
  Accumulator<OpenMD::Vector<double,_3U>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Accumulator<OpenMD::Vector<double,_3U>_> *in_stack_ffffffffffffff68;
  uint local_8c;
  Accumulator<OpenMD::Vector<double,_3U>_> *in_stack_ffffffffffffff78;
  Vector<double,_3U> local_38;
  int local_1c;
  ostream *local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  Vector3<double>::Vector3((Vector3<double> *)0x351090);
  sVar3 = Accumulator<OpenMD::Vector<double,_3U>_>::getCount
                    ((Accumulator<OpenMD::Vector<double,_3U>_> *)
                     ((in_RDI->super_Vector<double,_3U>).data_ + 1));
  if (local_1c == 0) {
    Accumulator<OpenMD::Vector<double,_3U>_>::get95percentConfidenceInterval
              (in_stack_ffffffffffffff78);
    Vector3<double>::operator=
              (in_RDI,(Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  else if (local_1c == 1) {
    Accumulator<OpenMD::Vector<double,_3U>_>::getStdDev(in_stack_ffffffffffffff78);
    Vector3<double>::operator=
              (in_RDI,(Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  else if (local_1c == 2) {
    Accumulator<OpenMD::Vector<double,_3U>_>::getVariance(in_stack_ffffffffffffff68);
    Vector3<double>::operator=
              (in_RDI,(Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  local_8c = 0;
  do {
    uVar2 = local_8c;
    Accumulator<OpenMD::Vector<double,_3U>_>::getAverage(in_stack_ffffffffffffff38);
    uVar1 = Vector<double,_3U>::size((Vector<double,_3U> *)&stack0xffffffffffffff58);
    if (uVar1 <= uVar2) {
      return;
    }
    if ((sVar3 == 0) && (local_1c == 0)) {
      std::operator<<(local_10,"\t");
    }
    else {
      pdVar4 = Vector<double,_3U>::operator[](&local_38,local_8c);
      uVar2 = std::isinf(*pdVar4);
      if ((uVar2 & 1) == 0) {
        pdVar4 = Vector<double,_3U>::operator[](&local_38,local_8c);
        uVar2 = std::isnan(*pdVar4);
        if ((uVar2 & 1) == 0) {
          if (sVar3 == 0) {
            std::operator<<(local_10,"\t");
          }
          else {
            in_stack_ffffffffffffff38 =
                 (Accumulator<OpenMD::Vector<double,_3U>_> *)std::operator<<(local_10,"\t");
            pdVar4 = Vector<double,_3U>::operator[](&local_38,local_8c);
            std::ostream::operator<<(in_stack_ffffffffffffff38,*pdVar4);
          }
          goto LAB_00351288;
        }
      }
      uVar5 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"%s",uVar5);
      painCave.isFatal = 1;
      simError();
    }
LAB_00351288:
    local_8c = local_8c + 1;
  } while( true );
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      Vector3d err;
      std::size_t count = Vector3dAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = Vector3dAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = Vector3dAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = Vector3dAccumulator::getVariance();
        break;
      default:
        break;
      }

      for (int i = 0; i < Vector3dAccumulator::getAverage().size(); i++) {
        if (count == 0 && errorHandling == ErrorHandling::CI95) {
          stream << "\t";
        } else {
          if (std::isinf(err[i]) || std::isnan(err[i])) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                     errorMessage.c_str());
            painCave.isFatal = 1;
            simError();
          } else {
            if (count == 0)
              stream << "\t";
            else
              stream << "\t" << err[i];
          }
        }
      }
    }